

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

char * lj_strfmt_wint(char *p,int32_t k)

{
  uint uVar1;
  uint32_t d_6;
  uint32_t d_5;
  uint32_t d_4;
  uint32_t d_3;
  uint32_t d_2;
  uint32_t d_1;
  uint32_t d;
  uint32_t w;
  uint32_t v;
  uint32_t u;
  int32_t k_local;
  char *p_local;
  
  u = k;
  p_local = p;
  if (k < 0) {
    u = (k ^ 0xffffffffU) + 1;
    p_local = p + 1;
    *p = '-';
  }
  if (u < 10000) {
    if (u < 10) goto LAB_00126155;
    if (99 < u) {
      if (999 < u) goto LAB_001260aa;
      goto LAB_001260e7;
    }
  }
  else {
    v = u / 10000;
    u = u % 10000;
    if (v < 10000) {
      if (9 < v) {
        if (99 < v) {
          if (999 < v) goto LAB_00125fe3;
          goto LAB_00126020;
        }
        goto LAB_00126057;
      }
    }
    else {
      w = v / 10000;
      v = v % 10000;
      if (9 < w) {
        uVar1 = w / 10;
        w = w % 10;
        *p_local = (char)uVar1 + '0';
        p_local = p_local + 1;
      }
      *p_local = (char)w + '0';
      p_local = p_local + 1;
LAB_00125fe3:
      uVar1 = v * 0x20c5 >> 0x17;
      v = v + uVar1 * -1000;
      *p_local = (char)uVar1 + '0';
      p_local = p_local + 1;
LAB_00126020:
      uVar1 = v * 0x29 >> 0xc;
      v = v + uVar1 * -100;
      *p_local = (char)uVar1 + '0';
      p_local = p_local + 1;
LAB_00126057:
      uVar1 = v * 0x67 >> 10;
      v = v + uVar1 * -10;
      *p_local = (char)uVar1 + '0';
      p_local = p_local + 1;
    }
    *p_local = (char)v + '0';
    p_local = p_local + 1;
LAB_001260aa:
    uVar1 = u * 0x20c5 >> 0x17;
    u = u + uVar1 * -1000;
    *p_local = (char)uVar1 + '0';
    p_local = p_local + 1;
LAB_001260e7:
    uVar1 = u * 0x29 >> 0xc;
    u = u + uVar1 * -100;
    *p_local = (char)uVar1 + '0';
    p_local = p_local + 1;
  }
  uVar1 = u * 0x67 >> 10;
  u = u + uVar1 * -10;
  *p_local = (char)uVar1 + '0';
  p_local = p_local + 1;
LAB_00126155:
  *p_local = (char)u + '0';
  return p_local + 1;
}

Assistant:

char * LJ_FASTCALL lj_strfmt_wint(char *p, int32_t k)
{
  uint32_t u = (uint32_t)k;
  if (k < 0) { u = ~u+1u; *p++ = '-'; }
  if (u < 10000) {
    if (u < 10) goto dig1;
    if (u < 100) goto dig2;
    if (u < 1000) goto dig3;
  } else {
    uint32_t v = u / 10000; u -= v * 10000;
    if (v < 10000) {
      if (v < 10) goto dig5;
      if (v < 100) goto dig6;
      if (v < 1000) goto dig7;
    } else {
      uint32_t w = v / 10000; v -= w * 10000;
      if (w >= 10) WINT_R(w, 10, 10)
      *p++ = (char)('0'+w);
    }
    WINT_R(v, 23, 1000)
    dig7: WINT_R(v, 12, 100)
    dig6: WINT_R(v, 10, 10)
    dig5: *p++ = (char)('0'+v);
  }
  WINT_R(u, 23, 1000)
  dig3: WINT_R(u, 12, 100)
  dig2: WINT_R(u, 10, 10)
  dig1: *p++ = (char)('0'+u);
  return p;
}